

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::~IfcStructuralPlanarAction
          (IfcStructuralPlanarAction *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x92dea0;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x92dfb8;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x92dec8;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x92def0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x92df18;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x92df40;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x92df68;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x92df90;
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x92e168;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x92e258;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x92e190;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x92e1b8;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x92e1e0;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x92e208;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x92e230;
  if (*(undefined1 **)&this[-1].field_0x190 != &this[-1].field_0x1a0) {
    operator_delete(*(undefined1 **)&this[-1].field_0x190,*(long *)&this[-1].field_0x1a0 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)puVar1,&PTR_construction_vtable_24__0092dfd8);
  operator_delete(puVar1,0x1c0);
  return;
}

Assistant:

IfcStructuralPlanarAction() : Object("IfcStructuralPlanarAction") {}